

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

void tcg_out_st(TCGContext_conflict9 *s,TCGType_conflict type,TCGReg arg,TCGReg arg1,intptr_t arg2)

{
  int iVar1;
  
  switch(type) {
  case TCG_TYPE_I32:
    if (arg < TCG_REG_XMM0) {
      iVar1 = 0x89;
LAB_00b26e27:
      tcg_out_modrm_offset(s,iVar1,arg,arg1,arg2);
      return;
    }
    iVar1 = 0x57e;
    break;
  case TCG_TYPE_I64:
    if (arg < TCG_REG_XMM0) {
      iVar1 = 0x1089;
      goto LAB_00b26e27;
    }
  case TCG_TYPE_V64:
    iVar1 = 0x5d6;
    break;
  case TCG_TYPE_V128:
    iVar1 = 0x57f;
    break;
  case TCG_TYPE_V256:
    iVar1 = 0xa017f;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0x486,(char *)0x0);
  }
  tcg_out_vex_modrm_offset(s,iVar1,arg,0,arg1,arg2);
  return;
}

Assistant:

static void tcg_out_st(TCGContext *s, TCGType type, TCGReg arg,
                       TCGReg arg1, intptr_t arg2)
{
    switch (type) {
    case TCG_TYPE_I32:
        if (arg < 16) {
            tcg_out_modrm_offset(s, OPC_MOVL_EvGv, arg, arg1, arg2);
        } else {
            tcg_out_vex_modrm_offset(s, OPC_MOVD_EyVy, arg, 0, arg1, arg2);
        }
        break;
    case TCG_TYPE_I64:
        if (arg < 16) {
            tcg_out_modrm_offset(s, OPC_MOVL_EvGv | P_REXW, arg, arg1, arg2);
            break;
        }
        /* FALLTHRU */
    case TCG_TYPE_V64:
        /* There is no instruction that can validate 8-byte alignment.  */
        tcg_debug_assert(arg >= 16);
        tcg_out_vex_modrm_offset(s, OPC_MOVQ_WqVq, arg, 0, arg1, arg2);
        break;
    case TCG_TYPE_V128:
        /*
         * The gvec infrastructure is asserts that v128 vector loads
         * and stores use a 16-byte aligned offset.  Validate that the
         * final pointer is aligned by using an insn that will SIGSEGV.
         */
        tcg_debug_assert(arg >= 16);
        tcg_out_vex_modrm_offset(s, OPC_MOVDQA_WxVx, arg, 0, arg1, arg2);
        break;
    case TCG_TYPE_V256:
        /*
         * The gvec infrastructure only requires 16-byte alignment,
         * so here we must use an unaligned store.
         */
        tcg_debug_assert(arg >= 16);
        tcg_out_vex_modrm_offset(s, OPC_MOVDQU_WxVx | P_VEXL,
                                 arg, 0, arg1, arg2);
        break;
    default:
        g_assert_not_reached();
    }
}